

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeLinear>::SideShapeFunction
          (TPZCompElHCurl<pzshape::TPZShapeLinear> *this,int side,TPZVec<double> *point,
          TPZFMatrix<double> *phi,TPZFMatrix<double> *curlphi)

{
  MElementType MVar1;
  TPZFMatrix<double> *curlphi_00;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  int64_t rows;
  long lVar11;
  long row;
  REAL detjac;
  MElementType local_3d6c;
  TPZFMatrix<double> *local_3d68;
  TPZFMatrix<double> *local_3d60;
  TPZGeoElSide gelside;
  TPZManVector<long,_2> ids;
  TPZManVector<int,_3> ordHCurl;
  TPZFMatrix<double> curlphiref;
  TPZFMatrix<double> phiref;
  TPZFNMatrix<9,_double> jac;
  TPZFNMatrix<9,_double> axes;
  TPZFNMatrix<9,_double> jacinv;
  TPZShapeData shapedata;
  
  local_3d68 = phi;
  local_3d60 = curlphi;
  iVar2 = pztopology::TPZLine::SideDimension(side);
  local_3d6c = pztopology::TPZLine::Type(side);
  uVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x310))(this,side);
  (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                         super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl +
              0xa8))(this,uVar3);
  iVar4 = pztopology::TPZLine::NContainedSides(side);
  uVar5 = pztopology::TPZLine::NSideNodes(side);
  shapedata._0_4_ = 0xffffffff;
  TPZManVector<int,_3>::TPZManVector(&ordHCurl,(long)(int)(iVar4 - uVar5),(int *)&shapedata);
  for (lVar11 = 0; (int)uVar5 + lVar11 < (long)iVar4; lVar11 = lVar11 + 1) {
    iVar6 = pztopology::TPZLine::ContainedSideLocId(side,uVar5 + (int)lVar11);
    iVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x338))(this,iVar6);
    ordHCurl.super_TPZVec<int>.fStore[lVar11] = iVar6;
  }
  shapedata._0_8_ = 0;
  TPZManVector<long,_2>::TPZManVector(&ids,(long)(int)uVar5,(long *)&shapedata);
  this_00 = TPZCompEl::Reference((TPZCompEl *)this);
  curlphi_00 = local_3d60;
  MVar1 = local_3d6c;
  uVar10 = 0;
  uVar9 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar9 = uVar10;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    iVar4 = pztopology::TPZLine::ContainedSideLocId(side,(int)uVar10);
    pTVar7 = TPZGeoEl::NodePtr(this_00,iVar4);
    ids.super_TPZVec<long>.fStore[uVar10] = (long)pTVar7->fId;
  }
  TPZShapeData::TPZShapeData(&shapedata);
  if (MVar1 == EOned) {
    TPZShapeHCurl<pzshape::TPZShapeLinear>::Initialize
              (&ids.super_TPZVec<long>,&ordHCurl.super_TPZVec<int>,&shapedata);
    iVar4 = TPZShapeHCurl<pzshape::TPZShapeLinear>::NHCurlShapeF(&shapedata);
    rows = 1;
  }
  else {
    if (MVar1 == ETriangle) {
      TPZShapeHCurl<pzshape::TPZShapeTriang>::Initialize
                (&ids.super_TPZVec<long>,&ordHCurl.super_TPZVec<int>,&shapedata);
      iVar4 = TPZShapeHCurl<pzshape::TPZShapeTriang>::NHCurlShapeF(&shapedata);
    }
    else {
      if (MVar1 != EQuadrilateral) {
        poVar8 = std::operator<<((ostream *)&std::cerr,
                                 "virtual void TPZCompElHCurl<pzshape::TPZShapeLinear>::SideShapeFunction(int, TPZVec<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &) [TSHAPE = pzshape::TPZShapeLinear]"
                                );
        std::operator<<(poVar8,"\n invalid side type.Aborting...\n");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
                   ,0x225);
      }
      TPZShapeHCurl<pzshape::TPZShapeQuad>::Initialize
                (&ids.super_TPZVec<long>,&ordHCurl.super_TPZVec<int>,&shapedata);
      iVar4 = TPZShapeHCurl<pzshape::TPZShapeQuad>::NHCurlShapeF(&shapedata);
    }
    rows = 2;
  }
  lVar11 = (long)iVar4;
  TPZFMatrix<double>::TPZFMatrix(&phiref,rows,lVar11);
  TPZFMatrix<double>::TPZFMatrix(&curlphiref,1,lVar11);
  if (MVar1 == EOned) {
    TPZShapeHCurl<pzshape::TPZShapeLinear>::Shape(point,&shapedata,&phiref,&curlphiref);
  }
  else if (MVar1 == ETriangle) {
    TPZShapeHCurl<pzshape::TPZShapeTriang>::Shape(point,&shapedata,&phiref,&curlphiref);
  }
  else {
    if (MVar1 != EQuadrilateral) {
      poVar8 = std::operator<<((ostream *)&std::cerr,
                               "virtual void TPZCompElHCurl<pzshape::TPZShapeLinear>::SideShapeFunction(int, TPZVec<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &) [TSHAPE = pzshape::TPZShapeLinear]"
                              );
      std::operator<<(poVar8,"\n invalid side type.Aborting...\n");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
                 ,0x23f);
    }
    TPZShapeHCurl<pzshape::TPZShapeQuad>::Shape(point,&shapedata,&phiref,&curlphiref);
  }
  gelside.fGeoEl = TPZCompEl::Reference((TPZCompEl *)this);
  gelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  row = (long)iVar2;
  gelside.fSide = side;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&jac,row,row);
  TPZFNMatrix<9,_double>::TPZFNMatrix(&jacinv,row,row);
  TPZFNMatrix<9,_double>::TPZFNMatrix(&axes,row,3);
  detjac = 0.0;
  TPZGeoElSide::Jacobian
            (&gelside,point,&jac.super_TPZFMatrix<double>,&axes.super_TPZFMatrix<double>,&detjac,
             &jacinv.super_TPZFMatrix<double>);
  (*(local_3d68->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe]
  )(local_3d68,lVar11,3);
  (*(curlphi_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe]
  )(curlphi_00,1,lVar11);
  TransformShape(&phiref,detjac,&jacinv.super_TPZFMatrix<double>,&axes.super_TPZFMatrix<double>,
                 local_3d68);
  if (iVar2 == 1) {
    TransformCurl<1>(&curlphiref,detjac,&jac.super_TPZFMatrix<double>,curlphi_00);
  }
  else if (iVar2 == 2) {
    TransformCurl<2>(&curlphiref,detjac,&jac.super_TPZFMatrix<double>,curlphi_00);
  }
  else if (iVar2 == 3) {
    TransformCurl<3>(&curlphiref,detjac,&jac.super_TPZFMatrix<double>,curlphi_00);
  }
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&axes);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&jacinv);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&jac);
  TPZFMatrix<double>::~TPZFMatrix(&curlphiref);
  TPZFMatrix<double>::~TPZFMatrix(&phiref);
  TPZShapeData::~TPZShapeData(&shapedata);
  TPZManVector<long,_2>::~TPZManVector(&ids);
  TPZManVector<int,_3>::~TPZManVector(&ordHCurl);
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::SideShapeFunction(int side,TPZVec<REAL> &point,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &curlphi)
{
    constexpr int dim = TSHAPE::Dimension;
    const int sideDim = TSHAPE::SideDimension(side);
    const MElementType sidetype = TSHAPE::Type(side);
#ifdef PZDEBUG
    if(side >= TSHAPE::NSides || side < TSHAPE::NCornerNodes){
        PZError<<__PRETTY_FUNCTION__<<"\n";
        PZError<<"There is no side shape associated to this side"<<"\n";
        DebugStop();
    }
	if( sideDim != point.size() ){
        PZError<<__PRETTY_FUNCTION__<<"\n";
        PZError<<"Wrong dimension of point! point dim: "<<point.size()<<"\tside dim: "<<sideDim<<"\n";
		return ;
	}
#endif

    const int connectLocalId = this->MidSideConnectLocId(side);
    const int connectOrder = this->Connect(connectLocalId).Order();
    const int nContainedSides = TSHAPE::NContainedSides(side);
    const int nSideNodes = TSHAPE::NSideNodes(side);
    const int nSideConnects = nContainedSides - nSideNodes;
    //vector with the connect order for each side of dim >=1 contained in side
    TPZManVector<int,TSHAPE::NSides> ordHCurl(nSideConnects,-1);
    for (auto is=nSideNodes; is< nContainedSides; is++) {
        const int subSide = TSHAPE::ContainedSideLocId(side,is);
        ordHCurl[is-nSideNodes] = this->EffectiveSideOrder(subSide);
    }
    
    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(nSideNodes,0);
    TPZGeoEl *ref = this->Reference();
    for (auto is=0; is< nSideNodes; is++) {
        const int subSide = TSHAPE::ContainedSideLocId(side,is);
        ids[is] = ref->NodePtr(subSide)->Id();
    }

    TPZShapeData shapedata;

    
    int sidedim{-1};
    int nshape{-1};
    switch(sidetype){
    case EOned:
        TPZShapeHCurl<pzshape::TPZShapeLinear>::Initialize(ids,ordHCurl,shapedata);
        nshape = TPZShapeHCurl<pzshape::TPZShapeLinear>::NHCurlShapeF(shapedata);
        sidedim = 1;
        break;
    case ETriangle:
        TPZShapeHCurl<pzshape::TPZShapeTriang>::Initialize(ids,ordHCurl,shapedata);
        nshape = TPZShapeHCurl<pzshape::TPZShapeTriang>::NHCurlShapeF(shapedata);
        sidedim = 2;
        break;
    case EQuadrilateral:
        TPZShapeHCurl<pzshape::TPZShapeQuad>::Initialize(ids,ordHCurl,shapedata);
        nshape = TPZShapeHCurl<pzshape::TPZShapeQuad>::NHCurlShapeF(shapedata);
        sidedim = 2;
        break;
    default:
        PZError<<__PRETTY_FUNCTION__
               <<"\n invalid side type.Aborting...\n";
        DebugStop();
    }

    const int curldim = [sidedim](){
        if (sidedim == 1) return 1;
        else{
            return 2*sidedim - 3;//1 for 2D 3 for 3D
        }
    }();
    
    TPZFMatrix<REAL> phiref(sidedim,nshape);
    TPZFMatrix<REAL> curlphiref(curldim,nshape);
    
    switch(sidetype){
    case EOned:
        TPZShapeHCurl<pzshape::TPZShapeLinear>::Shape(point, shapedata, phiref, curlphiref);
        break;
    case ETriangle:
        TPZShapeHCurl<pzshape::TPZShapeTriang>::Shape(point, shapedata, phiref, curlphiref);
        break;
    case EQuadrilateral:
        TPZShapeHCurl<pzshape::TPZShapeQuad>::Shape(point, shapedata, phiref, curlphiref);
        break;
    default:
        PZError<<__PRETTY_FUNCTION__
               <<"\n invalid side type.Aborting...\n";
        DebugStop();
    }

    //get the jacobian of the side transformation
    TPZGeoElSide gelside = TPZGeoElSide(this->Reference(),side);
    TPZFNMatrix<9,REAL> jac(sideDim,sideDim),jacinv(sideDim,sideDim),axes(sideDim,3);
    REAL detjac = 0;
    gelside.Jacobian(point, jac, axes, detjac, jacinv);


    phi.Redim(nshape,3);
    curlphi.Redim(curldim,nshape);
    
    TransformShape(phiref, detjac, jacinv, axes, phi);
    switch(sideDim){
    case 1:
        TransformCurl<1>(curlphiref, detjac, jac, curlphi);
        break;
    case 2:
        TransformCurl<2>(curlphiref, detjac, jac, curlphi);
        break;
    case 3:
        TransformCurl<3>(curlphiref, detjac, jac, curlphi);
        break;
    }
    
    
}